

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoboKin_dns.c
# Opt level: O0

int main(void)

{
  int iVar1;
  N_Vector y_00;
  FILE *__stream;
  double dVar2;
  FILE *FID;
  SUNLinearSolver LS;
  SUNMatrix J;
  void *kmem;
  int i;
  int retval;
  int mset;
  N_Vector constraints;
  N_Vector scale;
  N_Vector y;
  sunrealtype scsteptol;
  sunrealtype fnormtol;
  SUNContext sunctx;
  undefined8 in_stack_ffffffffffffff98;
  int opt;
  char *funcname;
  void *pvVar3;
  undefined8 local_50;
  int local_44;
  undefined4 local_40;
  undefined4 local_3c;
  long *local_38;
  undefined8 local_30;
  long *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_38 = (long *)0x0;
  local_30 = 0;
  local_28 = (long *)0x0;
  local_50 = 0;
  pvVar3 = (void *)0x0;
  funcname = (char *)0x0;
  printf("\nRobot Kinematics Example\n");
  printf("8 variables; -1 <= x_i <= 1\n");
  printf("KINSOL problem size: 8 + 2*8 = 24 \n\n");
  local_40 = SUNContext_Create(0,&local_10);
  opt = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  iVar1 = check_retval(pvVar3,funcname,opt);
  if (iVar1 == 0) {
    local_28 = (long *)N_VNew_Serial(0x18,local_10);
    iVar1 = check_retval(pvVar3,funcname,opt);
    if (iVar1 == 0) {
      local_30 = N_VNew_Serial(0x18,local_10);
      iVar1 = check_retval(pvVar3,funcname,opt);
      if (iVar1 == 0) {
        local_38 = (long *)N_VNew_Serial(0x18,local_10);
        iVar1 = check_retval(pvVar3,funcname,opt);
        if (iVar1 == 0) {
          local_50 = KINCreate(local_10);
          iVar1 = check_retval(pvVar3,funcname,opt);
          if (iVar1 == 0) {
            local_40 = KINInit(local_50,func,local_28);
            iVar1 = check_retval(pvVar3,funcname,opt);
            if (iVar1 == 0) {
              N_VConst(0,local_38);
              for (local_44 = 9; local_44 < 0x19; local_44 = local_44 + 1) {
                *(undefined8 *)(*(long *)(*local_38 + 0x10) + (long)(local_44 + -1) * 8) =
                     0x3ff0000000000000;
              }
              local_40 = KINSetConstraints(local_50,local_38);
              iVar1 = check_retval(pvVar3,funcname,opt);
              if (iVar1 == 0) {
                local_18 = 0x3ee4f8b588e368f1;
                local_40 = KINSetFuncNormTol(0x3ee4f8b588e368f1,local_50);
                iVar1 = check_retval(pvVar3,funcname,opt);
                if (iVar1 == 0) {
                  local_20 = 0x3ee4f8b588e368f1;
                  local_40 = KINSetScaledStepTol(0x3ee4f8b588e368f1,local_50);
                  iVar1 = check_retval(pvVar3,funcname,opt);
                  if (iVar1 == 0) {
                    pvVar3 = (void *)SUNDenseMatrix(0x18,0x18,local_10);
                    iVar1 = check_retval(pvVar3,funcname,opt);
                    if (iVar1 == 0) {
                      y_00 = (N_Vector)SUNLinSol_Dense(local_28,pvVar3,local_10);
                      iVar1 = check_retval(pvVar3,(char *)y_00,opt);
                      if (iVar1 == 0) {
                        local_40 = KINSetLinearSolver(local_50,y_00,pvVar3);
                        iVar1 = check_retval(pvVar3,(char *)y_00,opt);
                        if (iVar1 == 0) {
                          local_40 = KINSetJacFn(local_50,jac);
                          iVar1 = check_retval(pvVar3,(char *)y_00,opt);
                          if (iVar1 == 0) {
                            local_3c = 1;
                            local_40 = KINSetMaxSetupCalls(local_50,1);
                            iVar1 = check_retval(pvVar3,(char *)y_00,opt);
                            if (iVar1 == 0) {
                              N_VConst(0x3ff0000000000000,local_28);
                              for (local_44 = 1; local_44 < 9; local_44 = local_44 + 1) {
                                dVar2 = sqrt(2.0);
                                *(double *)(*(long *)(*local_28 + 0x10) + (long)(local_44 + -1) * 8)
                                     = dVar2 / 2.0;
                              }
                              printf("Initial guess:\n");
                              PrintOutput(y_00);
                              N_VConst(0x3ff0000000000000,local_30);
                              local_40 = KINSol(local_50,local_28,1,local_30,local_30);
                              iVar1 = check_retval(pvVar3,(char *)y_00,opt);
                              if (iVar1 == 0) {
                                printf("\nComputed solution:\n");
                                PrintOutput(y_00);
                                printf("\nFinal statsistics:\n");
                                local_40 = KINPrintAllStats(local_50,_stdout,0);
                                __stream = fopen("kinRoboKin_dns_stats.csv","w");
                                local_40 = KINPrintAllStats(local_50,__stream,1);
                                fclose(__stream);
                                N_VDestroy(local_28);
                                N_VDestroy(local_30);
                                N_VDestroy(local_38);
                                KINFree(&local_50);
                                SUNLinSolFree(y_00);
                                SUNMatDestroy(pvVar3);
                                SUNContext_Free(&local_10);
                                local_4 = 0;
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, scsteptol;
  N_Vector y, scale, constraints;
  int mset, retval, i;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;
  FILE* FID;

  y = scale = constraints = NULL;
  kmem                    = NULL;
  J                       = NULL;
  LS                      = NULL;

  printf("\nRobot Kinematics Example\n");
  printf("8 variables; -1 <= x_i <= 1\n");
  printf("KINSOL problem size: 8 + 2*8 = 24 \n\n");

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Create vectors for solution, scales, and constraints */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize and allocate memory for KINSOL */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  retval = KINInit(kmem, func, y); /* y passed as a template */
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* Set optional inputs */

  N_VConst(ZERO, constraints);
  for (i = NVAR + 1; i <= NEQ; i++) { Ith(constraints, i) = ONE; }

  retval = KINSetConstraints(kmem, constraints);
  if (check_retval(&retval, "KINSetConstraints", 1)) { return (1); }

  fnormtol = FTOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  scsteptol = STOL;
  retval    = KINSetScaledStepTol(kmem, scsteptol);
  if (check_retval(&retval, "KINSetScaledStepTol", 1)) { return (1); }

  /* Create dense SUNMatrix */
  J = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)J, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to KINSOL */
  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* Set the Jacobian function */
  retval = KINSetJacFn(kmem, jac);
  if (check_retval(&retval, "KINSetJacFn", 1)) { return (1); }

  /* Indicate exact Newton */

  mset   = 1;
  retval = KINSetMaxSetupCalls(kmem, mset);
  if (check_retval(&retval, "KINSetMaxSetupCalls", 1)) { return (1); }

  /* Initial guess */

  N_VConst(ONE, y);
  for (i = 1; i <= NVAR; i++) { Ith(y, i) = SUNRsqrt(TWO) / TWO; }

  printf("Initial guess:\n");
  PrintOutput(y);

  /* Call KINSol to solve problem */

  N_VConst(ONE, scale);
  retval = KINSol(kmem,           /* KINSol memory block */
                  y,              /* initial guess on input; solution vector */
                  KIN_LINESEARCH, /* global strategy choice */
                  scale,          /* scaling vector, for the variable cc */
                  scale);         /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  printf("\nComputed solution:\n");
  PrintOutput(y);

  /* Print final statistics to screen and file */

  printf("\nFinal statsistics:\n");
  retval = KINPrintAllStats(kmem, stdout, SUN_OUTPUTFORMAT_TABLE);

  FID    = fopen("kinRoboKin_dns_stats.csv", "w");
  retval = KINPrintAllStats(kmem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* free memory */
  N_VDestroy(y);
  N_VDestroy(scale);
  N_VDestroy(constraints);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  SUNContext_Free(&sunctx);

  return (0);
}